

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Progress.cpp
# Opt level: O2

string * __thiscall
Progress::formatTime_abi_cxx11_(string *__return_storage_ptr__,Progress *this,time_t t)

{
  ulong uVar1;
  char *__format;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  allocator<char> local_89;
  char buffer [128];
  
  uVar1 = t % 0x15180;
  uVar2 = (long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 0xe10 &
          0xffffffff;
  uVar3 = (ulong)(uint)(int)(short)((short)(t % 0xe10) / 0x3c);
  if ((int)(t / 0x15180) == 0) {
    if (uVar1 + 0xe0f < 0x1c1f) {
      snprintf(buffer,0x80,"%02d:%02d",uVar3,t % 0x3c & 0xffffffff);
      goto LAB_00104b32;
    }
    __format = "%d:%02d:%02d";
    uVar4 = t % 0x3c & 0xffffffff;
    uVar1 = uVar2;
    uVar2 = uVar3;
  }
  else {
    __format = "%dd %d:%02d:%02d";
    uVar1 = t / 0x15180;
    uVar4 = uVar3;
  }
  snprintf(buffer,0x80,__format,uVar1,uVar2,uVar4);
LAB_00104b32:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,buffer,&local_89);
  return __return_storage_ptr__;
}

Assistant:

std::string Progress::formatTime (time_t t)
{
  char buffer [128];

  int days    =  t          / 86400;
  int hours   = (t % 86400) / 3600;
  int minutes = (t %  3600) / 60;
  int seconds =  t % 60;

  if (days)
    snprintf (buffer, 128, "%dd %d:%02d:%02d", days, hours, minutes, seconds);
  else if (hours)
    snprintf (buffer, 128,     "%d:%02d:%02d",       hours, minutes, seconds);
  else
    snprintf (buffer, 128,        "%02d:%02d",              minutes, seconds);

  return std::string (buffer);
}